

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::PlyParser::parseHeader
          (PlyParser *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *header)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  reference __rhs;
  runtime_error *prVar3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000050;
  stringstream *in_stack_00000058;
  PlyParser *in_stack_00000060;
  string version;
  string fmt;
  string tag;
  stringstream line;
  char *in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  stringstream *this_00;
  string local_278 [32];
  int local_258;
  undefined1 local_251;
  string local_250 [32];
  string local_230 [39];
  undefined1 local_209;
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [392];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  do {
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_10);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __rhs = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffd27,
                                CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)));
    _Var2 = std::operator|(_S_out,_S_in);
    this_00 = local_198;
    std::__cxx11::stringstream::stringstream(this_00,(string *)__rhs,_Var2);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffd27,
                            CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)));
    std::__cxx11::string::string(local_1b8);
    std::operator>>((istream *)this_00,local_1b8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd27,
                                     CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)),
                            in_stack_fffffffffffffd18);
    if (bVar1) {
LAB_003fb56e:
      local_258 = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd27,
                                       CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)
                                      ),in_stack_fffffffffffffd18);
      if (bVar1) {
        std::__cxx11::string::string(local_1e8);
        std::operator>>((istream *)local_198,local_1e8);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffd27,
                                          CONCAT16(in_stack_fffffffffffffd26,
                                                   in_stack_fffffffffffffd20)),
                                in_stack_fffffffffffffd18);
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0x260) = 0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffd27,
                                              CONCAT16(in_stack_fffffffffffffd26,
                                                       in_stack_fffffffffffffd20)),
                                  in_stack_fffffffffffffd18);
          if (bVar1) {
            *(undefined4 *)(in_RDI + 0x260) = 1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffd27,
                                                CONCAT16(in_stack_fffffffffffffd26,
                                                         in_stack_fffffffffffffd20)),
                                    in_stack_fffffffffffffd18);
            if (!bVar1) {
              local_209 = 1;
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((char *)this_00,__rhs);
              std::runtime_error::runtime_error(prVar3,local_208);
              local_209 = 0;
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *(undefined4 *)(in_RDI + 0x260) = 2;
          }
        }
        std::__cxx11::string::string(local_230);
        std::operator>>((istream *)local_198,local_230);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffd27,
                                          CONCAT16(in_stack_fffffffffffffd26,
                                                   in_stack_fffffffffffffd20)),
                                in_stack_fffffffffffffd18);
        if (bVar1) {
          local_251 = 1;
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)this_00,__rhs);
          std::runtime_error::runtime_error(prVar3,local_250);
          local_251 = 0;
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_1e8);
        goto LAB_003fb56e;
      }
      in_stack_fffffffffffffd27 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffd27,
                                    CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)),
                           in_stack_fffffffffffffd18);
      if (!(bool)in_stack_fffffffffffffd27) {
        in_stack_fffffffffffffd26 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffd27,
                                      CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20))
                             ,in_stack_fffffffffffffd18);
        if (!(bool)in_stack_fffffffffffffd26) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)this_00,__rhs);
          std::runtime_error::runtime_error(prVar3,local_278);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        parseElementDescr(in_stack_00000060,in_stack_00000058,in_stack_00000050);
        goto LAB_003fb56e;
      }
      local_258 = 3;
    }
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::stringstream::~stringstream(local_198);
    if (local_258 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void parseHeader(std::list<std::string>& header) 
      {
        while (!header.empty())
        {          
          std::stringstream line(header.front()); 
          header.pop_front();
          
          std::string tag; line >> tag;
          
          /* ignore comments */
          if (tag == "comment") {
          }
          
          /* parse format */
          else if (tag == "format")  
          {
            std::string fmt; line >> fmt;
            if (fmt == "ascii") format = ASCII;
            else if (fmt == "binary_big_endian") format = BINARY_BIG_ENDIAN;
            else if (fmt == "binary_little_endian") format = BINARY_LITTLE_ENDIAN;
            else throw std::runtime_error("invalid PLY file format: " + fmt);
            std::string  version; line >> version;
            if (version != "1.0") throw std::runtime_error("invalid PLY file version: " + version);
          }

          /* parse end of header tag */
          else if (tag == "end_header")
            break;
          
          /* parse elements */
          else if (tag == "element") parseElementDescr(line,header);
      
          /* report unknown tags */
          else throw std::runtime_error("unknown tag in PLY file: " + tag);
        }
      }